

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBufferPool.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanCommandBufferPool::RecycleCommandBuffer
          (VulkanCommandBufferPool *this,VkCommandBuffer *CmdBuffer)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> Lock;
  VkCommandBuffer *CmdBuffer_local;
  VulkanCommandBufferPool *this_local;
  
  Lock._M_device = (mutex_type *)CmdBuffer;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_Mutex);
  std::deque<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>>::
  emplace_back<VkCommandBuffer_T*&>
            ((deque<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>> *)&this->m_CmdBuffers,
             (VkCommandBuffer_T **)Lock._M_device);
  ((Lock._M_device)->super___mutex_base)._M_mutex.__align = 0;
  std::__atomic_base<int>::operator--(&(this->m_BuffCounter).super___atomic_base<int>);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void VulkanCommandBufferPool::RecycleCommandBuffer(VkCommandBuffer&& CmdBuffer)
{
    std::lock_guard<std::mutex> Lock{m_Mutex};
    m_CmdBuffers.emplace_back(CmdBuffer);
    CmdBuffer = VK_NULL_HANDLE;
#ifdef DILIGENT_DEVELOPMENT
    --m_BuffCounter;
#endif
}